

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_clock.c
# Opt level: O1

void csp_clock_get_time(csp_timestamp_t *time)

{
  int iVar1;
  timespec ts;
  timespec local_20;
  
  iVar1 = clock_gettime(0,&local_20);
  if (iVar1 == 0) {
    time->tv_sec = (uint32_t)local_20.tv_sec;
  }
  else {
    time->tv_sec = 0;
    local_20.tv_nsec._0_4_ = 0;
  }
  time->tv_nsec = (uint32_t)local_20.tv_nsec;
  return;
}

Assistant:

__weak void csp_clock_get_time(csp_timestamp_t * time) {

	struct timespec ts;
	if (clock_gettime(CLOCK_REALTIME, &ts) == 0) {
		time->tv_sec = ts.tv_sec;
		time->tv_nsec = ts.tv_nsec;
	} else {
		time->tv_sec = 0;
		time->tv_nsec = 0;
	}
}